

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::resume_state_machine_execution(raft_server *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  nuraft_global_mgr *this_00;
  char *pcVar4;
  long in_RDI;
  ptr<raft_server> *in_stack_00000028;
  nuraft_global_mgr *in_stack_00000030;
  unique_lock<std::mutex> l;
  nuraft_global_mgr *mgr;
  mutex_type *in_stack_ffffffffffffff68;
  unique_lock<std::mutex> *in_stack_ffffffffffffff70;
  atomic<bool> *in_stack_ffffffffffffff78;
  atomic<bool> *local_78;
  string local_28 [40];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x20a2e2);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x20a305);
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffff78);
      if (bVar1) {
        local_78 = (atomic<bool> *)0x2737a8;
      }
      else {
        local_78 = (atomic<bool> *)0x2737af;
      }
      bVar1 = std::atomic::operator_cast_to_bool(local_78);
      pcVar4 = "SLEEPING";
      if (bVar1) {
        pcVar4 = "RUNNING";
      }
      msg_if_given_abi_cxx11_
                ((char *)local_28,"resume state machine execution, previously %s, state machine %s",
                 local_78,pcVar4);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"resume_state_machine_execution",0x386,local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff70,
             SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  this_00 = nuraft_global_mgr::get_instance();
  if (this_00 == (nuraft_global_mgr *)0x0) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff70);
  }
  else {
    std::enable_shared_from_this<nuraft::raft_server>::shared_from_this
              ((enable_shared_from_this<nuraft::raft_server> *)this_00);
    nuraft_global_mgr::request_commit(in_stack_00000030,in_stack_00000028);
    std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x20a444);
  }
  return;
}

Assistant:

void raft_server::resume_state_machine_execution() {
    p_in( "resume state machine execution, previously %s, state machine %s",
          sm_commit_paused_ ? "PAUSED" : "ACTIVE",
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING" );
    sm_commit_paused_ = false;

    nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
    if (mgr) {
        // Global mgr.
        mgr->request_commit( this->shared_from_this() );
    } else {
        // Local commit thread.
        std::unique_lock<std::mutex> l(commit_cv_lock_);
        commit_cv_.notify_one();
    }
}